

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-spell.c
# Opt level: O0

_Bool spell_menu_handler(menu_conflict *m,ui_event *e,wchar_t oid)

{
  long *plVar1;
  spell_menu_data *d;
  wchar_t oid_local;
  ui_event *e_local;
  menu_conflict *m_local;
  
  plVar1 = (long *)menu_priv(m);
  if (e->type == EVT_SELECT) {
    *(undefined4 *)((long)plVar1 + 0x1c) = *(undefined4 *)(*plVar1 + (long)oid * 4);
    m_local._7_1_ = (*(byte *)((long)plVar1 + 0xc) & 1) != 0;
  }
  else {
    if ((e->type == EVT_KBRD) && ((e->key).code == 0x3f)) {
      *(byte *)(plVar1 + 3) = (*(byte *)(plVar1 + 3) ^ 0xff) & 1;
    }
    m_local._7_1_ = false;
  }
  return m_local._7_1_;
}

Assistant:

static bool spell_menu_handler(struct menu *m, const ui_event *e, int oid)
{
	struct spell_menu_data *d = menu_priv(m);

	if (e->type == EVT_SELECT) {
		d->selected_spell = d->spells[oid];
		return d->browse ? true : false;
	}
	else if (e->type == EVT_KBRD) {
		if (e->key.code == '?') {
			d->show_description = !d->show_description;
		}
	}

	return false;
}